

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall wabt::SharedValidator::OnBr(SharedValidator *this,Location *loc,Var *depth)

{
  Result RVar1;
  Result RVar2;
  char *pcVar3;
  int __c;
  
  pcVar3 = (char *)0xb;
  RVar1 = CheckInstr(this,(Opcode)0xb,loc);
  pcVar3 = Var::index(depth,pcVar3,__c);
  RVar2 = TypeChecker::OnBr(&this->typechecker_,(Index)pcVar3);
  RVar1.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnBr(const Location& loc, Var depth) {
  Result result = CheckInstr(Opcode::Br, loc);
  result |= typechecker_.OnBr(depth.index());
  return result;
}